

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::LowerCase(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  string *n;
  undefined8 local_30;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)in_RDI);
  for (local_30 = 0; uVar2 = std::__cxx11::string::size(), local_30 < uVar2; local_30 = local_30 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    iVar1 = tolower((int)*pcVar3);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *puVar4 = (char)iVar1;
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::LowerCase(const std::string& s)
{
  std::string n;
  n.resize(s.size());
  for (size_t i = 0; i < s.size(); i++) {
    n[i] = static_cast<std::string::value_type>(tolower(s[i]));
  }
  return n;
}